

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

void Acb_CollectIntNodes(Gia_Man_t *p,Vec_Int_t *vNodes0,Vec_Int_t *vNodes1)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  
  vNodes0->nSize = 0;
  vNodes1->nSize = 0;
  Gia_ManIncrementTravId(p);
  if (p->nObjs < 1) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->nTravIdsAlloc < 1) {
LAB_00396d78:
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x261,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  pGVar2 = p->pObjs;
  piVar3 = p->pTravIds;
  *piVar3 = p->nTravIds;
  pVVar5 = p->vCis;
  if (0 < pVVar5->nSize) {
    piVar4 = pVVar5->pArray;
    lVar6 = 0;
    do {
      iVar1 = piVar4[lVar6];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00396d59;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      if (p->nTravIdsAlloc <= iVar1) goto LAB_00396d78;
      piVar3[iVar1] = p->nTravIds;
      lVar6 = lVar6 + 1;
    } while (lVar6 < pVVar5->nSize);
  }
  pVVar5 = p->vCos;
  if (0 < pVVar5->nSize) {
    lVar6 = 0;
    do {
      iVar1 = pVVar5->pArray[lVar6];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00396d59;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (lVar6 != 0) {
        pGVar2 = p->pObjs + iVar1;
        Acb_CollectIntNodes_rec
                  (p,pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff),vNodes1);
      }
      lVar6 = lVar6 + 1;
      pVVar5 = p->vCos;
    } while (lVar6 < pVVar5->nSize);
  }
  pVVar5 = p->vCos;
  if (0 < pVVar5->nSize) {
    lVar6 = 0;
    do {
      iVar1 = pVVar5->pArray[lVar6];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_00396d59:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      if (lVar6 == 0) {
        pGVar2 = p->pObjs + iVar1;
        Acb_CollectIntNodes_rec
                  (p,pGVar2 + -(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff),vNodes0);
      }
      lVar6 = lVar6 + 1;
      pVVar5 = p->vCos;
    } while (lVar6 < pVVar5->nSize);
  }
  return;
}

Assistant:

void Acb_CollectIntNodes( Gia_Man_t * p, Vec_Int_t * vNodes0, Vec_Int_t * vNodes1 )
{
    Gia_Obj_t * pObj; int i;
    Vec_IntClear( vNodes0 );
    Vec_IntClear( vNodes1 );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Gia_ManForEachCi( p, pObj, i )
        Gia_ObjSetTravIdCurrent( p, pObj );
    Gia_ManForEachCo( p, pObj, i )
        if ( i > 0 )
            Acb_CollectIntNodes_rec( p, Gia_ObjFanin0(pObj), vNodes1 );
    Gia_ManForEachCo( p, pObj, i )
        if ( i == 0 )
            Acb_CollectIntNodes_rec( p, Gia_ObjFanin0(pObj), vNodes0 );
}